

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.h
# Opt level: O2

void __thiscall adios2::core::Attribute<unsigned_short>::~Attribute(Attribute<unsigned_short> *this)

{
  (this->super_AttributeBase)._vptr_AttributeBase = (_func_int **)&PTR__Attribute_008194f0;
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&(this->m_DataArray).
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  AttributeBase::~AttributeBase(&this->super_AttributeBase);
  return;
}

Assistant:

~Attribute() = default;